

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O2

void __thiscall QGraphicsRotation::setAxis(QGraphicsRotation *this,QVector3D *axis)

{
  long lVar1;
  float fVar2;
  float fVar3;
  
  lVar1 = *(long *)(this + 8);
  fVar2 = (float)*(undefined8 *)(lVar1 + 0x98);
  fVar3 = (float)*(undefined8 *)axis->v;
  if ((((fVar2 == fVar3) && (!NAN(fVar2) && !NAN(fVar3))) &&
      ((float)((ulong)*(undefined8 *)(lVar1 + 0x98) >> 0x20) ==
       (float)((ulong)*(undefined8 *)axis->v >> 0x20))) &&
     ((*(float *)(lVar1 + 0xa0) == axis->v[2] &&
      (!NAN(*(float *)(lVar1 + 0xa0)) && !NAN(axis->v[2]))))) {
    return;
  }
  *(float *)(lVar1 + 0xa0) = axis->v[2];
  *(undefined8 *)(lVar1 + 0x98) = *(undefined8 *)axis->v;
  QGraphicsTransform::update((QGraphicsTransform *)this);
  axisChanged(this);
  return;
}

Assistant:

void QGraphicsRotation::setAxis(const QVector3D &axis)
{
    Q_D(QGraphicsRotation);
    if (d->axis == axis)
         return;
    d->axis = axis;
    update();
    emit axisChanged();
}